

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Householder.h
# Opt level: O2

void __thiscall
Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,2,2,0,2,2>,-1,-1,false>>::
applyHouseholderOnTheRight<Eigen::Block<Eigen::Matrix<double,2,2,0,2,2>const,_1,1,false>>
          (MatrixBase<Eigen::Block<Eigen::Matrix<double,2,2,0,2,2>,_1,_1,false>> *this,
          Block<const_Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,_1,_false> *essential,Scalar *tau,
          Scalar *workspace)

{
  Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false>,__1,__1,_false> *local_170
  ;
  Transpose<const_Eigen::Block<const_Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,_1,_false>_> local_168
  ;
  Map<Eigen::Matrix<double,__1,_1,_0,_2,_1>,_0,_Eigen::Stride<0,_0>_> tmp;
  CoeffBasedProduct<Eigen::Matrix<double,__1,_1,_0,_2,_1>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,_1,_false>_>,_256>
  local_128;
  CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,_const_Eigen::Map<Eigen::Matrix<double,__1,_1,_0,_2,_1>,_0,_Eigen::Stride<0,_0>_>_>
  local_98;
  Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false>,__1,__1,_false> right;
  
  if (*(long *)(this + 0x10) == 1) {
    local_128.m_lhs.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,_2,_1>_>.m_storage.m_data.
    array[0] = 1.0 - *tau;
    DenseBase<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_-1,_-1,_false>_>::operator*=
              ((DenseBase<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false>_> *)this
               ,(Scalar *)&local_128);
  }
  else {
    MapBase<Eigen::Map<Eigen::Matrix<double,_-1,_1,_0,_2,_1>,_0,_Eigen::Stride<0,_0>_>,_0>::MapBase
              ((MapBase<Eigen::Map<Eigen::Matrix<double,__1,_1,_0,_2,_1>,_0,_Eigen::Stride<0,_0>_>,_0>
                *)&tmp,workspace,*(Index *)(this + 8));
    Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_-1,_-1,_false>,_-1,_-1,_false>::Block
              (&right,(Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false> *)this,0,1,
               *(Index *)(this + 8),*(long *)(this + 0x10) + -1);
    CoeffBasedProduct<Eigen::Block<Eigen::Block<Eigen::Matrix<double,2,2,0,2,2>,-1,-1,false>,-1,-1,false>const,Eigen::Block<Eigen::Matrix<double,2,2,0,2,2>const,-1,1,false>const,6>
    ::
    CoeffBasedProduct<Eigen::Block<Eigen::Block<Eigen::Matrix<double,2,2,0,2,2>,_1,_1,false>,_1,_1,false>,Eigen::Block<Eigen::Matrix<double,2,2,0,2,2>const,_1,1,false>>
              ((CoeffBasedProduct<Eigen::Block<Eigen::Block<Eigen::Matrix<double,2,2,0,2,2>,_1,_1,false>,_1,_1,false>const,Eigen::Block<Eigen::Matrix<double,2,2,0,2,2>const,_1,1,false>const,6>
                *)&local_128,&right,essential);
    DenseBase<Eigen::Map<Eigen::Matrix<double,-1,1,0,2,1>,0,Eigen::Stride<0,0>>>::
    lazyAssign<Eigen::CoeffBasedProduct<Eigen::Block<Eigen::Block<Eigen::Matrix<double,2,2,0,2,2>,_1,_1,false>,_1,_1,false>const,Eigen::Block<Eigen::Matrix<double,2,2,0,2,2>const,_1,1,false>const,6>>
              ((DenseBase<Eigen::Map<Eigen::Matrix<double,_1,1,0,2,1>,0,Eigen::Stride<0,0>>> *)&tmp,
               (DenseBase<Eigen::CoeffBasedProduct<const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false>,__1,__1,_false>,_const_Eigen::Block<const_Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,_1,_false>,_6>_>
                *)&local_128);
    Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_-1,_-1,_false>,_-1,_1,_true>::Block
              ((Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false>,__1,_1,_true>
                *)&local_128,(Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false> *)this,0);
    MatrixBase<Eigen::Map<Eigen::Matrix<double,-1,1,0,2,1>,0,Eigen::Stride<0,0>>>::operator+=
              ((MatrixBase<Eigen::Map<Eigen::Matrix<double,_1,1,0,2,1>,0,Eigen::Stride<0,0>>> *)&tmp
               ,(MatrixBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false>,__1,_1,_true>_>
                 *)&local_128);
    local_168.m_matrix.
    super_BlockImpl<const_Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,_1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<const_Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,_1,_false,_true>.m_xpr =
         (Nested)*tau;
    local_168.m_matrix.
    super_BlockImpl<const_Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,_1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<const_Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,_1,_false,_true>.
    super_MapBase<Eigen::Block<const_Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,_1,_false>,_0>.m_data
         = (PointerType)tmp._0_8_;
    local_168.m_matrix.
    super_BlockImpl<const_Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,_1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<const_Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,_1,_false,_true>.
    super_MapBase<Eigen::Block<const_Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,_1,_false>,_0>.m_rows.
    m_value = tmp._8_8_;
    Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,_-1,_-1,_false>,_-1,_1,_true>::Block
              ((Block<Eigen::Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false>,__1,_1,_true>
                *)&local_128,(Block<Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,__1,_false> *)this,0);
    MatrixBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,2,2,0,2,2>,-1,-1,false>,-1,1,true>>::
    operator-=((MatrixBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,2,2,0,2,2>,_1,_1,false>,_1,1,true>>
                *)&local_128,
               (MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,_const_Eigen::Map<Eigen::Matrix<double,__1,_1,_0,_2,_1>,_0,_Eigen::Stride<0,_0>_>_>_>
                *)&local_168);
    local_98.m_functor.m_other = *tau;
    local_98.m_xpr._0_8_ = tmp._0_8_;
    local_98.m_xpr._8_8_ = tmp._8_8_;
    local_168.m_matrix.
    super_BlockImpl<const_Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,_1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<const_Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,_1,_false,_true>.
    super_MapBase<Eigen::Block<const_Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,_1,_false>,_0>.m_data
         = (essential->
           super_BlockImpl<const_Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,_1,_false,_Eigen::Dense>).
           super_BlockImpl_dense<const_Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,_1,_false,_true>.
           super_MapBase<Eigen::Block<const_Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,_1,_false>,_0>.
           m_data;
    local_168.m_matrix.
    super_BlockImpl<const_Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,_1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<const_Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,_1,_false,_true>.
    super_MapBase<Eigen::Block<const_Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,_1,_false>,_0>.m_rows.
    m_value = (essential->
              super_BlockImpl<const_Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,_1,_false,_Eigen::Dense>
              ).
              super_BlockImpl_dense<const_Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,_1,_false,_true>.
              super_MapBase<Eigen::Block<const_Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,_1,_false>,_0>
              .m_rows.m_value;
    local_168.m_matrix.
    super_BlockImpl<const_Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,_1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<const_Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,_1,_false,_true>.m_xpr =
         (essential->
         super_BlockImpl<const_Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,_1,_false,_Eigen::Dense>).
         super_BlockImpl_dense<const_Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,_1,_false,_true>.m_xpr
    ;
    local_168.m_matrix.
    super_BlockImpl<const_Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,_1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<const_Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,_1,_false,_true>.
    m_outerStride =
         (essential->
         super_BlockImpl<const_Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,_1,_false,_Eigen::Dense>).
         super_BlockImpl_dense<const_Eigen::Matrix<double,_2,_2,_0,_2,_2>,__1,_1,_false,_true>.
         m_outerStride;
    CoeffBasedProduct<Eigen::Matrix<double,-1,1,0,2,1>,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,2,2,0,2,2>const,-1,1,false>const>const,256>
    ::
    CoeffBasedProduct<Eigen::CwiseUnaryOp<Eigen::internal::scalar_multiple_op<double>,Eigen::Map<Eigen::Matrix<double,_1,1,0,2,1>,0,Eigen::Stride<0,0>>const>,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,2,2,0,2,2>const,_1,1,false>const>>
              ((CoeffBasedProduct<Eigen::Matrix<double,_1,1,0,2,1>,Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,2,2,0,2,2>const,_1,1,false>const>const,256>
                *)&local_128,&local_98,&local_168);
    local_170 = &right;
    NoAlias<Eigen::Block<Eigen::Block<Eigen::Matrix<double,2,2,0,2,2>,-1,-1,false>,-1,-1,false>,Eigen::MatrixBase>
    ::operator-=((NoAlias<Eigen::Block<Eigen::Block<Eigen::Matrix<double,2,2,0,2,2>,_1,_1,false>,_1,_1,false>,Eigen::MatrixBase>
                  *)&local_170,&local_128);
  }
  return;
}

Assistant:

void MatrixBase<Derived>::applyHouseholderOnTheRight(
  const EssentialPart& essential,
  const Scalar& tau,
  Scalar* workspace)
{
  if(cols() == 1)
  {
    *this *= Scalar(1)-tau;
  }
  else
  {
    Map<typename internal::plain_col_type<PlainObject>::type> tmp(workspace,rows());
    Block<Derived, Derived::RowsAtCompileTime, EssentialPart::SizeAtCompileTime> right(derived(), 0, 1, rows(), cols()-1);
    tmp.noalias() = right * essential.conjugate();
    tmp += this->col(0);
    this->col(0) -= tau * tmp;
    right.noalias() -= tau * tmp * essential.transpose();
  }
}